

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O1

counter * counter::instance(string *name)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  ulong uVar4;
  counter *pcVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  if (instance(std::__cxx11::string_const&)::all == '\0') {
    instance();
  }
  uVar4 = (ulong)instance::curr;
  bVar7 = 0 < (long)uVar4;
  if (0 < (long)uVar4) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar1 = name->_M_string_length;
    pcVar5 = instance::all;
    uVar6 = 1;
    do {
      __n = (pcVar5->name)._M_string_length;
      if ((__n == sVar1) &&
         ((name = &pcVar5->name, __n == 0 ||
          (iVar2 = bcmp((pcVar5->name)._M_dataplus._M_p,__s2,__n), iVar2 == 0)))) break;
      bVar7 = uVar6 < uVar4;
      pcVar5 = pcVar5 + 1;
      bVar8 = uVar6 != uVar4;
      name = &pcVar5->name;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  if (!bVar7) {
    std::__cxx11::string::_M_assign((string *)(instance::all + uVar4));
    lVar3 = (long)instance::curr;
    instance::curr = instance::curr + 1;
    name = &instance::all[lVar3].name;
  }
  return (counter *)name;
}

Assistant:

static counter *instance(std::string const &name)
	{
		static const int max = 20;
		static int curr;
		static counter all[max];
		for(int i=0;i<curr;i++)
			if(all[i].name==name)
				return all + i;
		assert(curr < max);
		all[curr].name = name;
		return all + curr++;
	}